

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict try_arg_f(c2m_ctx_t c2m_ctx,nonterm_arg_func_t f,node_t_conflict arg)

{
  size_t mark;
  node_t_conflict pnVar1;
  
  mark = record_start(c2m_ctx);
  pnVar1 = type_spec(c2m_ctx,1,(node_t_conflict)f);
  record_stop(c2m_ctx,mark,(uint)(pnVar1 == &err_struct));
  return pnVar1;
}

Assistant:

static node_t try_arg_f (c2m_ctx_t c2m_ctx, nonterm_arg_func_t f, node_t arg) {
  size_t mark = record_start (c2m_ctx);
  node_t r = (f) (c2m_ctx, TRUE, arg);

  record_stop (c2m_ctx, mark, r == err_node);
  return r;
}